

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
                  *this)

{
  SIMDSimplePFor<FastPForLib::Simple8b<true>_> *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00480d28;
  VariableByte::~VariableByte((VariableByte *)0x14ca7a);
  SIMDSimplePFor<FastPForLib::Simple8b<true>_>::~SIMDSimplePFor(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}